

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureBarrierTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::TextureBarrierBasicOutline::verifyTextureData(TextureBarrierBasicOutline *this)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  GLuint *pGVar6;
  GLuint *pGVar7;
  ulong uVar8;
  bool bVar9;
  bool bVar10;
  
  iVar2 = (*((this->super_TextureBarrierBaseTest).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  uVar8 = 0;
  bVar9 = false;
  do {
    (**(code **)(CONCAT44(extraout_var,iVar2) + 8))((uint)uVar8 | 0x84c0);
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0xaa0))(0xde1,0,0x8d94,0x1405,this->m_actual);
    uVar1 = this->m_width;
    bVar10 = uVar1 != 0;
    if (bVar10) {
      uVar3 = 0;
      do {
        if ((ulong)this->m_height != 0) {
          uVar5 = 0;
          uVar4 = uVar3;
          do {
            if ((bool)(bVar10 & -1 < (int)(uVar3 | (uint)uVar5))) {
              pGVar7 = this->m_reference[uVar8] + uVar4;
            }
            else {
              texel(unsigned_int*,unsigned_int,unsigned_int)::zero = 0;
              pGVar7 = &texel(unsigned_int*,unsigned_int,unsigned_int)::zero;
            }
            if ((bool)(bVar10 & -1 < (int)(uVar3 | (uint)uVar5))) {
              pGVar6 = this->m_actual + uVar4;
            }
            else {
              texel(unsigned_int*,unsigned_int,unsigned_int)::zero = 0;
              pGVar6 = &texel(unsigned_int*,unsigned_int,unsigned_int)::zero;
            }
            if (*pGVar7 != *pGVar6) {
              if (bVar10) {
                return bVar9;
              }
              goto LAB_00a4b9bc;
            }
            uVar5 = uVar5 + 1;
            uVar4 = uVar4 + uVar1;
          } while (this->m_height != uVar5);
        }
        uVar3 = uVar3 + 1;
        bVar10 = uVar3 < uVar1;
      } while (uVar3 != uVar1);
    }
LAB_00a4b9bc:
    bVar9 = 6 < uVar8;
    uVar8 = uVar8 + 1;
    if (uVar8 == 8) {
      return bVar9;
    }
  } while( true );
}

Assistant:

bool verifyTextureData()
	{
		const glw::Functions& gl = m_context.getRenderContext().getFunctions();

		for (GLuint i = 0; i < NUM_TEXTURES; ++i)
		{
			gl.activeTexture(GL_TEXTURE0 + i);
			gl.getTexImage(GL_TEXTURE_2D, 0, GL_RED_INTEGER, GL_UNSIGNED_INT, m_actual);

			for (GLuint x = 0; x < m_width; ++x)
				for (GLuint y = 0; y < m_height; ++y)
				{
					if (texel(m_reference[i], x, y) != texel(m_actual, x, y))
					{
						return false;
					}
				}
		}

		return true;
	}